

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  raw serializer;
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> sample;
  _data_t local_39;
  _serializer_t local_38;
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> local_30;
  
  local_30._serialize = &local_38;
  local_38._os = (ostream *)&std::cout;
  local_30.helper.child = &local_30;
  local_30.child = (terminal_t *)&kiste::terminal;
  local_30.data = &local_39;
  local_30.helper.data = local_30.data;
  local_30.helper._serialize = local_30._serialize;
  test::Sample_t<kiste::terminal_t,_Data,_kiste::raw>::render(local_30.helper.child);
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::raw{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}